

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

void __thiscall Message::Message(Message *this,Message *msg)

{
  size_t sVar1;
  
  (this->o)._M_dataplus._M_p = (pointer)&(this->o).field_2;
  (this->o)._M_string_length = 0;
  (this->o).field_2._M_local_buf[0] = '\0';
  this->c = 0;
  (this->d)._M_dataplus._M_p = (pointer)&(this->d).field_2;
  (this->d)._M_string_length = 0;
  (this->d).field_2._M_local_buf[0] = '\0';
  this->v = 0;
  this->n = 0;
  this->i = 0;
  (this->m)._M_dataplus._M_p = (pointer)&(this->m).field_2;
  (this->m)._M_string_length = 0;
  (this->m).field_2._M_local_buf[0] = '\0';
  this->msg_type = msg->msg_type;
  this->t = msg->t;
  this->c = msg->c;
  std::__cxx11::string::_M_assign((string *)&this->o);
  std::__cxx11::string::_M_assign((string *)&this->d);
  sVar1 = msg->n;
  this->v = msg->v;
  this->n = sVar1;
  return;
}

Assistant:

Message::Message(const Message &msg) {
  msg_type = msg.msg_type;
  t = msg.t;
  c = msg.c;
  o = msg.o;
  d = msg.d;
  v = msg.v;
  n = msg.n;
}